

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

shared_ptr<helics::Broker> helics::BrokerFactory::getConnectedBroker(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<helics::Broker> sVar1;
  function<bool_(const_std::shared_ptr<helics::Broker>_&)> *in_stack_00000020;
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_stack_00000028;
  function<bool_(const_std::shared_ptr<helics::Broker>_&)> *in_stack_ffffffffffffffc0;
  anon_class_1_0_00000001 local_28 [40];
  
  std::function<bool(std::shared_ptr<helics::Broker>const&)>::
  function<helics::BrokerFactory::getConnectedBroker()::__0,void>
            (in_stack_ffffffffffffffc0,local_28);
  gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::findObject
            (in_stack_00000028,in_stack_00000020);
  std::function<bool_(const_std::shared_ptr<helics::Broker>_&)>::~function
            ((function<bool_(const_std::shared_ptr<helics::Broker>_&)> *)0x43dd3b);
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::Broker>)
         sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> getConnectedBroker()
{
    return searchableBrokers.findObject([](auto& ptr) { return ptr->isConnected(); });
}